

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

send_result_t
zmq::send_multipart<std::initializer_list<zmq::const_buffer>,void>
          (socket_ref s,initializer_list<zmq::const_buffer> *msgs,send_flags flags)

{
  const_buffer *pcVar1;
  bool bVar2;
  const_buffer *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  send_flags b;
  int in_R8D;
  send_result_t sVar5;
  ssize_t local_88 [2];
  send_flags local_74;
  const_buffer *pcStack_70;
  send_flags msg_flags;
  const_buffer *next;
  size_t msg_count;
  size_type local_58;
  const_buffer *local_50;
  const_buffer *end_it;
  size_type local_40;
  const_buffer *local_38;
  const_buffer *it;
  initializer_list<zmq::const_buffer> *piStack_28;
  send_flags flags_local;
  initializer_list<zmq::const_buffer> *msgs_local;
  socket_ref s_local;
  bool local_10;
  
  end_it = msgs->_M_array;
  local_40 = msgs->_M_len;
  it._4_4_ = flags;
  piStack_28 = msgs;
  msgs_local = (initializer_list<zmq::const_buffer> *)s.super_socket_base._handle;
  local_38 = std::begin<zmq::const_buffer>(*msgs);
  msg_count = (size_t)piStack_28->_M_array;
  local_58 = piStack_28->_M_len;
  local_50 = std::end<zmq::const_buffer>(*piStack_28);
  next = (const_buffer *)0x0;
  do {
    if (local_38 == local_50) {
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)&s_local,(unsigned_long *)&next);
      uVar4 = extraout_RDX_00;
LAB_0017c6e9:
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)s_local.super_socket_base._handle;
      return (send_result_t)
             sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    pcStack_70 = std::next<zmq::const_buffer_const*>(local_38,1);
    b = sndmore;
    if (pcStack_70 == local_50) {
      b = none;
    }
    local_74 = operator|(it._4_4_,b);
    local_88[0] = detail::socket_base::send
                            ((socket_base *)&msgs_local,(int)local_38->_data,(void *)local_38->_size
                             ,(ulong)local_74,in_R8D);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_88);
    pcVar1 = local_38;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar3 = std::begin<zmq::const_buffer>(*piStack_28);
      if (pcVar1 != pcVar3) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::initializer_list<zmq::const_buffer>]"
                     );
      }
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&s_local);
      uVar4 = extraout_RDX;
      goto LAB_0017c6e9;
    }
    next = (const_buffer *)((long)&next->_data + 1);
    local_38 = pcStack_70;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}